

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O0

int convtable(lua_State *L)

{
  table *ptVar1;
  int sizearray_00;
  int iVar2;
  context *ctx_00;
  size_t sVar3;
  uint8_t *puVar4;
  value *pvVar5;
  node *pnVar6;
  int local_3c;
  int i_1;
  int sizehash;
  int sizearray;
  table *tbl;
  context *ctx;
  int i;
  lua_State *L_local;
  
  ctx_00 = (context *)lua_touserdata(L,2);
  ptVar1 = ctx_00->tbl;
  ptVar1->L = ctx_00->L;
  sVar3 = lua_rawlen(L,1);
  sizearray_00 = (int)sVar3;
  if (sizearray_00 == 0) {
LAB_0012d477:
    iVar2 = countsize(L,sizearray_00);
    if (iVar2 == 0) {
      for (local_3c = 1; local_3c <= sizearray_00; local_3c = local_3c + 1) {
        lua_rawgeti(L,1,(long)local_3c);
        setarray(ctx_00,L,-1,local_3c);
        lua_settop(L,-2);
      }
    }
    else {
      pnVar6 = (node *)malloc((long)iVar2 * 0x18);
      ptVar1->hash = pnVar6;
      if (ptVar1->hash == (node *)0x0) goto LAB_0012d580;
      for (ctx._4_4_ = 0; ctx._4_4_ < iVar2; ctx._4_4_ = ctx._4_4_ + 1) {
        ptVar1->hash[ctx._4_4_].valuetype = '\0';
        ptVar1->hash[ctx._4_4_].nocolliding = '\0';
      }
      ptVar1->sizehash = iVar2;
      fillnocolliding(L,ctx_00);
      fillcolliding(L,ctx_00);
    }
    L_local._4_4_ = 0;
  }
  else {
    puVar4 = (uint8_t *)malloc((long)sizearray_00);
    ptVar1->arraytype = puVar4;
    if (ptVar1->arraytype != (uint8_t *)0x0) {
      for (ctx._4_4_ = 0; ctx._4_4_ < sizearray_00; ctx._4_4_ = ctx._4_4_ + 1) {
        ptVar1->arraytype[ctx._4_4_] = '\0';
      }
      pvVar5 = (value *)malloc((long)sizearray_00 << 3);
      ptVar1->array = pvVar5;
      if (ptVar1->array != (value *)0x0) {
        ptVar1->sizearray = sizearray_00;
        goto LAB_0012d477;
      }
    }
LAB_0012d580:
    L_local._4_4_ = luaL_error(L,"memory error");
  }
  return L_local._4_4_;
}

Assistant:

static int
convtable(lua_State *L) {
	int i;
	struct context *ctx = lua_touserdata(L,2);
	struct table *tbl = ctx->tbl;

	tbl->L = ctx->L;

	int sizearray = lua_rawlen(L, 1);
	if (sizearray) {
		tbl->arraytype = (uint8_t *)malloc(sizearray * sizeof(uint8_t));
		if (tbl->arraytype == NULL) {
			goto memerror;
		}
		for (i=0;i<sizearray;i++) {
			tbl->arraytype[i] = VALUETYPE_NIL;
		}
		tbl->array = (union value *)malloc(sizearray * sizeof(union value));
		if (tbl->array == NULL) {
			goto memerror;
		}
		tbl->sizearray = sizearray;
	}
	int sizehash = countsize(L, sizearray);
	if (sizehash) {
		tbl->hash = (struct node *)malloc(sizehash * sizeof(struct node));
		if (tbl->hash == NULL) {
			goto memerror;
		}
		for (i=0;i<sizehash;i++) {
			tbl->hash[i].valuetype = VALUETYPE_NIL;
			tbl->hash[i].nocolliding = 0;
		}
		tbl->sizehash = sizehash;

		fillnocolliding(L, ctx);
		fillcolliding(L, ctx);
	} else {
		int i;
		for (i=1;i<=sizearray;i++) {
			lua_rawgeti(L, 1, i);
			setarray(ctx, L, -1, i);
			lua_pop(L,1);
		}
	}

	return 0;
memerror:
	return luaL_error(L, "memory error");
}